

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

LY_ERR lys_precompile_mod_augments_deviations(lysp_module *pmod,ly_set *mod_set)

{
  lysp_node_augment *plVar1;
  lysp_ext_substmt *plVar2;
  void *pvVar3;
  lysp_ext_substmt *plVar4;
  ly_bool lVar5;
  LY_ERR LVar6;
  lysp_ext_instance *plVar7;
  lysp_ext_instance *plVar8;
  void **ppvVar9;
  lysp_ext_substmt *plVar10;
  long lVar11;
  lysp_ext_instance *plVar12;
  void **ppvVar13;
  lysp_node_augment **pplVar14;
  lys_module *m;
  ly_set *local_10f0;
  ly_set set;
  lysc_ctx local_10d0;
  
  local_10f0 = mod_set;
  memset(&local_10d0.groupings,0,0x1080);
  set.size = 0;
  set.count = 0;
  set.field_2.dnodes = (lyd_node **)0x0;
  local_10d0.cur_mod = pmod->mod;
  local_10d0.ctx = (local_10d0.cur_mod)->ctx;
  local_10d0.ext = (lysc_ext_instance *)0x0;
  local_10d0.path_len = 1;
  local_10d0.path[0] = '/';
  pplVar14 = &pmod->augments;
  local_10d0.pmod = pmod;
  local_10d0.free_ctx.ctx = local_10d0.ctx;
  while (plVar1 = *pplVar14, plVar1 != (lysp_node_augment *)0x0) {
    lysc_update_path(&local_10d0,(lys_module *)0x0,"{augment}");
    lysc_update_path(&local_10d0,(lys_module *)0x0,(plVar1->field_0).node.name);
    LVar6 = lys_nodeid_mod_check
                      (&local_10d0,(plVar1->field_0).node.name,'\x01',&set,(lysc_nodeid **)0x0,&m);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    if ((LVar6 != LY_SUCCESS) ||
       (((LVar6 = lys_array_add_mod_ref(&local_10d0,pmod->mod,&m->augmented_by), LVar6 != LY_EEXIST
         || (lVar5 = lys_precompile_mod_set_is_all_implemented(&set), lVar5 == '\0')) &&
        (LVar6 = ly_set_merge(local_10f0,&set,'\0',(_func_void_ptr_void_ptr *)0x0),
        LVar6 != LY_SUCCESS)))) goto LAB_0014e8dc;
    ly_set_erase(&set,(_func_void_void_ptr *)0x0);
    pplVar14 = (lysp_node_augment **)&(plVar1->field_0).node.next;
  }
  lVar11 = 0;
  plVar12 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (pmod->deviations == (lysp_deviation *)0x0) {
      plVar7 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar7 = pmod->deviations[-1].exts;
    }
    if (plVar7 <= plVar12) {
      plVar12 = (lysp_ext_instance *)0x0;
      goto LAB_0014e7d5;
    }
    lysc_update_path(&local_10d0,(lys_module *)0x0,"{deviation}");
    lysc_update_path(&local_10d0,(lys_module *)0x0,
                     *(char **)((long)&pmod->deviations->nodeid + lVar11));
    LVar6 = lys_nodeid_mod_check
                      (&local_10d0,*(char **)((long)&pmod->deviations->nodeid + lVar11),'\x01',&set,
                       (lysc_nodeid **)0x0,&m);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    if ((LVar6 != LY_SUCCESS) ||
       (((LVar6 = lys_array_add_mod_ref(&local_10d0,pmod->mod,&m->deviated_by), LVar6 != LY_EEXIST
         || (lVar5 = lys_precompile_mod_set_is_all_implemented(&set), lVar5 == '\0')) &&
        (LVar6 = ly_set_merge(local_10f0,&set,'\0',(_func_void_ptr_void_ptr *)0x0),
        LVar6 != LY_SUCCESS)))) break;
    ly_set_erase(&set,(_func_void_void_ptr *)0x0);
    plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
    lVar11 = lVar11 + 0x28;
  }
LAB_0014e8dc:
  ly_set_erase(&set,(_func_void_void_ptr *)0x0);
  return LVar6;
LAB_0014e7d5:
  plVar7 = pmod->exts;
  if (plVar7 == (lysp_ext_instance *)0x0) {
    plVar8 = (lysp_ext_instance *)0x0;
  }
  else {
    plVar8 = plVar7[-1].exts;
  }
  if (plVar8 <= plVar12) {
    LVar6 = LY_SUCCESS;
    goto LAB_0014e8dc;
  }
  plVar2 = plVar7[(long)plVar12].substmts;
  ppvVar9 = (void **)0xffffffffffffffff;
  plVar4 = plVar2;
  do {
    plVar10 = plVar4;
    if (plVar2 == (lysp_ext_substmt *)0x0) {
      ppvVar13 = (void **)0x0;
    }
    else {
      ppvVar13 = plVar2[-1].storage_p;
    }
    ppvVar9 = (void **)((long)ppvVar9 + 1);
    if (ppvVar13 <= ppvVar9) goto LAB_0014e8ce;
    plVar4 = plVar10 + 1;
  } while (plVar10->stmt != LY_STMT_AUGMENT);
  pvVar3 = *plVar10->storage_p;
  if (pvVar3 != (void *)0x0) {
    lysc_update_path(&local_10d0,(lys_module *)0x0,"{ext-augment}");
    lysc_update_path(&local_10d0,(lys_module *)0x0,*(char **)((long)pvVar3 + 0x18));
    LVar6 = lys_nodeid_mod_check
                      (&local_10d0,*(char **)((long)pvVar3 + 0x18),'\x01',&set,(lysc_nodeid **)0x0,
                       &m);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    if ((LVar6 != LY_SUCCESS) ||
       (((LVar6 = lys_array_add_mod_ref(&local_10d0,pmod->mod,&m->augmented_by), LVar6 != LY_EEXIST
         || (lVar5 = lys_precompile_mod_set_is_all_implemented(&set), lVar5 == '\0')) &&
        (LVar6 = ly_set_merge(local_10f0,&set,'\0',(_func_void_ptr_void_ptr *)0x0),
        LVar6 != LY_SUCCESS)))) goto LAB_0014e8dc;
    ly_set_erase(&set,(_func_void_void_ptr *)0x0);
  }
LAB_0014e8ce:
  plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
  goto LAB_0014e7d5;
}

Assistant:

static LY_ERR
lys_precompile_mod_augments_deviations(struct lysp_module *pmod, struct ly_set *mod_set)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;
    struct lysc_ctx ctx = {0};
    struct lys_module *m;
    struct lysp_node_augment *aug;
    struct ly_set set = {0};

    LYSC_CTX_INIT_PMOD(ctx, pmod, NULL);

    LY_LIST_FOR(pmod->augments, aug) {
        /* get target module */
        lysc_update_path(&ctx, NULL, "{augment}");
        lysc_update_path(&ctx, NULL, aug->nodeid);
        ret = lys_nodeid_mod_check(&ctx, aug->nodeid, 1, &set, NULL, &m);
        lysc_update_path(&ctx, NULL, NULL);
        lysc_update_path(&ctx, NULL, NULL);
        LY_CHECK_GOTO(ret, cleanup);

        /* add this module into the target module augmented_by, if not there and implemented */
        if ((lys_array_add_mod_ref(&ctx, pmod->mod, &m->augmented_by) != LY_EEXIST) ||
                !lys_precompile_mod_set_is_all_implemented(&set)) {
            LY_CHECK_GOTO(ret = ly_set_merge(mod_set, &set, 0, NULL), cleanup);
        }
        ly_set_erase(&set, NULL);
    }

    LY_ARRAY_FOR(pmod->deviations, u) {
        /* get target module */
        lysc_update_path(&ctx, NULL, "{deviation}");
        lysc_update_path(&ctx, NULL, pmod->deviations[u].nodeid);
        ret = lys_nodeid_mod_check(&ctx, pmod->deviations[u].nodeid, 1, &set, NULL, &m);
        lysc_update_path(&ctx, NULL, NULL);
        lysc_update_path(&ctx, NULL, NULL);
        LY_CHECK_GOTO(ret, cleanup);

        /* add this module into the target module deviated_by, if not there and implemented */
        if ((lys_array_add_mod_ref(&ctx, pmod->mod, &m->deviated_by) != LY_EEXIST) ||
                !lys_precompile_mod_set_is_all_implemented(&set)) {
            LY_CHECK_GOTO(ret = ly_set_merge(mod_set, &set, 0, NULL), cleanup);
        }
        ly_set_erase(&set, NULL);
    }

    LY_ARRAY_FOR(pmod->exts, u) {
        aug = NULL;
        LY_ARRAY_FOR(pmod->exts[u].substmts, v) {
            if (pmod->exts[u].substmts[v].stmt == LY_STMT_AUGMENT) {
                aug = *(pmod->exts[u].substmts[v].storage_p);
                break;
            }
        }
        if (!aug) {
            continue;
        }

        /* get target module */
        lysc_update_path(&ctx, NULL, "{ext-augment}");
        lysc_update_path(&ctx, NULL, aug->nodeid);
        ret = lys_nodeid_mod_check(&ctx, aug->nodeid, 1, &set, NULL, &m);
        lysc_update_path(&ctx, NULL, NULL);
        lysc_update_path(&ctx, NULL, NULL);
        LY_CHECK_GOTO(ret, cleanup);

        /* add this module into the target module augmented_by, if not there and implemented */
        if ((lys_array_add_mod_ref(&ctx, pmod->mod, &m->augmented_by) != LY_EEXIST) ||
                !lys_precompile_mod_set_is_all_implemented(&set)) {
            LY_CHECK_GOTO(ret = ly_set_merge(mod_set, &set, 0, NULL), cleanup);
        }
        ly_set_erase(&set, NULL);
    }

cleanup:
    ly_set_erase(&set, NULL);
    return ret;
}